

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

bool embree::sse42::
     BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::QuadMvIntersectorKMoeller<4,_4,_false>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray
                ,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  int iVar13;
  int iVar14;
  ulong uVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  ulong *puVar25;
  ulong uVar26;
  byte bVar27;
  ulong unaff_RBP;
  ulong uVar28;
  long lVar29;
  ulong uVar30;
  ulong uVar31;
  bool bVar32;
  ulong uVar33;
  ulong uVar34;
  size_t *psVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  uint uVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  uint uVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  uint uVar51;
  float fVar52;
  float fVar53;
  vint4 bi;
  float fVar54;
  uint uVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  uint uVar59;
  uint uVar60;
  float fVar61;
  float fVar62;
  uint uVar63;
  uint uVar64;
  float fVar65;
  float fVar66;
  uint uVar67;
  uint uVar68;
  float fVar69;
  vint4 ai;
  float fVar70;
  uint uVar71;
  uint uVar72;
  float fVar73;
  uint uVar74;
  float fVar75;
  float fVar76;
  float fVar77;
  uint uVar78;
  float fVar79;
  float fVar80;
  float fVar81;
  uint uVar82;
  float fVar83;
  float fVar84;
  float fVar85;
  vint4 ai_1;
  uint uVar86;
  float fVar87;
  float fVar88;
  float fVar89;
  float fVar90;
  float fVar91;
  float fVar92;
  float fVar93;
  float fVar94;
  float fVar95;
  float fVar96;
  float fVar97;
  float fVar98;
  float fVar99;
  float fVar100;
  float fVar101;
  float fVar102;
  float fVar103;
  float fVar104;
  float fVar105;
  float fVar106;
  float fVar107;
  float fVar108;
  float fVar109;
  float fVar110;
  float fVar111;
  float fVar112;
  float fVar113;
  float fVar114;
  float fVar115;
  float fVar116;
  float fVar117;
  float fVar118;
  float fVar119;
  float fVar120;
  float fVar121;
  NodeRef stack [244];
  size_t local_7d8;
  ulong local_7d0 [244];
  
  puVar25 = local_7d0;
  local_7d8 = root.ptr;
  fVar7 = *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar8 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  fVar9 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  fVar10 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar11 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar12 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  uVar26 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar31 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar33 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  iVar13 = (tray->tnear).field_0.i[k];
  iVar14 = (tray->tfar).field_0.i[k];
  bVar32 = true;
  do {
    psVar35 = &local_7d8;
    uVar34 = puVar25[-1];
    puVar25 = puVar25 + -1;
    while ((uVar34 & 8) == 0) {
      pfVar1 = (float *)(uVar34 + 0x20 + uVar26);
      fVar42 = (*pfVar1 - fVar7) * fVar10;
      fVar46 = (pfVar1[1] - fVar7) * fVar10;
      fVar50 = (pfVar1[2] - fVar7) * fVar10;
      fVar54 = (pfVar1[3] - fVar7) * fVar10;
      pfVar1 = (float *)(uVar34 + 0x20 + uVar31);
      fVar58 = (*pfVar1 - fVar8) * fVar11;
      fVar62 = (pfVar1[1] - fVar8) * fVar11;
      fVar66 = (pfVar1[2] - fVar8) * fVar11;
      fVar70 = (pfVar1[3] - fVar8) * fVar11;
      uVar59 = (uint)((int)fVar58 < (int)fVar42) * (int)fVar42 |
               (uint)((int)fVar58 >= (int)fVar42) * (int)fVar58;
      uVar63 = (uint)((int)fVar62 < (int)fVar46) * (int)fVar46 |
               (uint)((int)fVar62 >= (int)fVar46) * (int)fVar62;
      uVar67 = (uint)((int)fVar66 < (int)fVar50) * (int)fVar50 |
               (uint)((int)fVar66 >= (int)fVar50) * (int)fVar66;
      uVar71 = (uint)((int)fVar70 < (int)fVar54) * (int)fVar54 |
               (uint)((int)fVar70 >= (int)fVar54) * (int)fVar70;
      pfVar1 = (float *)(uVar34 + 0x20 + uVar33);
      fVar42 = (*pfVar1 - fVar9) * fVar12;
      fVar46 = (pfVar1[1] - fVar9) * fVar12;
      fVar50 = (pfVar1[2] - fVar9) * fVar12;
      fVar54 = (pfVar1[3] - fVar9) * fVar12;
      uVar43 = (uint)((int)fVar42 < iVar13) * iVar13 | (uint)((int)fVar42 >= iVar13) * (int)fVar42;
      uVar47 = (uint)((int)fVar46 < iVar13) * iVar13 | (uint)((int)fVar46 >= iVar13) * (int)fVar46;
      uVar51 = (uint)((int)fVar50 < iVar13) * iVar13 | (uint)((int)fVar50 >= iVar13) * (int)fVar50;
      uVar55 = (uint)((int)fVar54 < iVar13) * iVar13 | (uint)((int)fVar54 >= iVar13) * (int)fVar54;
      pfVar1 = (float *)(uVar34 + 0x20 + (uVar26 ^ 0x10));
      fVar42 = (*pfVar1 - fVar7) * fVar10;
      fVar46 = (pfVar1[1] - fVar7) * fVar10;
      fVar50 = (pfVar1[2] - fVar7) * fVar10;
      fVar54 = (pfVar1[3] - fVar7) * fVar10;
      pfVar1 = (float *)(uVar34 + 0x20 + (uVar31 ^ 0x10));
      fVar58 = (*pfVar1 - fVar8) * fVar11;
      fVar62 = (pfVar1[1] - fVar8) * fVar11;
      fVar66 = (pfVar1[2] - fVar8) * fVar11;
      fVar70 = (pfVar1[3] - fVar8) * fVar11;
      uVar74 = (uint)((int)fVar42 < (int)fVar58) * (int)fVar42 |
               (uint)((int)fVar42 >= (int)fVar58) * (int)fVar58;
      uVar78 = (uint)((int)fVar46 < (int)fVar62) * (int)fVar46 |
               (uint)((int)fVar46 >= (int)fVar62) * (int)fVar62;
      uVar82 = (uint)((int)fVar50 < (int)fVar66) * (int)fVar50 |
               (uint)((int)fVar50 >= (int)fVar66) * (int)fVar66;
      uVar86 = (uint)((int)fVar54 < (int)fVar70) * (int)fVar54 |
               (uint)((int)fVar54 >= (int)fVar70) * (int)fVar70;
      pfVar1 = (float *)(uVar34 + 0x20 + (uVar33 ^ 0x10));
      fVar42 = (*pfVar1 - fVar9) * fVar12;
      fVar46 = (pfVar1[1] - fVar9) * fVar12;
      fVar50 = (pfVar1[2] - fVar9) * fVar12;
      fVar54 = (pfVar1[3] - fVar9) * fVar12;
      uVar60 = (uint)(iVar14 < (int)fVar42) * iVar14 | (uint)(iVar14 >= (int)fVar42) * (int)fVar42;
      uVar64 = (uint)(iVar14 < (int)fVar46) * iVar14 | (uint)(iVar14 >= (int)fVar46) * (int)fVar46;
      uVar68 = (uint)(iVar14 < (int)fVar50) * iVar14 | (uint)(iVar14 >= (int)fVar50) * (int)fVar50;
      uVar72 = (uint)(iVar14 < (int)fVar54) * iVar14 | (uint)(iVar14 >= (int)fVar54) * (int)fVar54;
      auVar16._4_4_ =
           -(uint)((int)(((int)uVar78 < (int)uVar64) * uVar78 |
                        ((int)uVar78 >= (int)uVar64) * uVar64) <
                  (int)(((int)uVar47 < (int)uVar63) * uVar63 | ((int)uVar47 >= (int)uVar63) * uVar47
                       ));
      auVar16._0_4_ =
           -(uint)((int)(((int)uVar74 < (int)uVar60) * uVar74 |
                        ((int)uVar74 >= (int)uVar60) * uVar60) <
                  (int)(((int)uVar43 < (int)uVar59) * uVar59 | ((int)uVar43 >= (int)uVar59) * uVar43
                       ));
      auVar16._8_4_ =
           -(uint)((int)(((int)uVar82 < (int)uVar68) * uVar82 |
                        ((int)uVar82 >= (int)uVar68) * uVar68) <
                  (int)(((int)uVar51 < (int)uVar67) * uVar67 | ((int)uVar51 >= (int)uVar67) * uVar51
                       ));
      auVar16._12_4_ =
           -(uint)((int)(((int)uVar86 < (int)uVar72) * uVar86 |
                        ((int)uVar86 >= (int)uVar72) * uVar72) <
                  (int)(((int)uVar55 < (int)uVar71) * uVar71 | ((int)uVar55 >= (int)uVar71) * uVar55
                       ));
      uVar43 = movmskps((int)unaff_RBP,auVar16);
      unaff_RBP = (ulong)uVar43;
      if (uVar43 == 0xf) goto joined_r0x0026b546;
      bVar27 = (byte)uVar43 ^ 0xf;
      uVar28 = uVar34 & 0xfffffffffffffff0;
      lVar29 = 0;
      if (bVar27 != 0) {
        for (; (bVar27 >> lVar29 & 1) == 0; lVar29 = lVar29 + 1) {
        }
      }
      uVar34 = *(ulong *)(uVar28 + lVar29 * 8);
      uVar43 = bVar27 - 1 & (uint)bVar27;
      unaff_RBP = (ulong)uVar43;
      if (uVar43 != 0) {
        *puVar25 = uVar34;
        puVar25 = puVar25 + 1;
        lVar29 = 0;
        if (unaff_RBP != 0) {
          for (; (uVar43 >> lVar29 & 1) == 0; lVar29 = lVar29 + 1) {
          }
        }
        uVar34 = *(ulong *)(uVar28 + lVar29 * 8);
        uVar43 = uVar43 - 1 & uVar43;
        uVar30 = (ulong)uVar43;
        if (uVar43 != 0) {
          do {
            *puVar25 = uVar34;
            puVar25 = puVar25 + 1;
            lVar29 = 0;
            if (uVar30 != 0) {
              for (; (uVar30 >> lVar29 & 1) == 0; lVar29 = lVar29 + 1) {
              }
            }
            unaff_RBP = uVar30 - 1;
            uVar34 = *(ulong *)(uVar28 + lVar29 * 8);
            uVar30 = uVar30 & unaff_RBP;
          } while (uVar30 != 0);
        }
      }
    }
    uVar28 = (ulong)((uint)uVar34 & 0xf);
    if (uVar28 != 8) {
      uVar34 = uVar34 & 0xfffffffffffffff0;
      fVar42 = *(float *)(ray + k * 4);
      fVar46 = *(float *)(ray + k * 4 + 0x10);
      fVar50 = *(float *)(ray + k * 4 + 0x20);
      fVar54 = *(float *)(ray + k * 4 + 0x40);
      fVar58 = *(float *)(ray + k * 4 + 0x50);
      fVar62 = *(float *)(ray + k * 4 + 0x60);
      unaff_RBP = 0;
      do {
        lVar29 = unaff_RBP * 0xe0;
        pfVar1 = (float *)(uVar34 + lVar29);
        fVar66 = *pfVar1;
        fVar70 = pfVar1[1];
        fVar39 = pfVar1[2];
        fVar41 = pfVar1[3];
        pfVar1 = (float *)(uVar34 + 0x10 + lVar29);
        fVar61 = *pfVar1;
        fVar65 = pfVar1[1];
        fVar69 = pfVar1[2];
        fVar73 = pfVar1[3];
        pfVar1 = (float *)(uVar34 + 0x20 + lVar29);
        fVar76 = *pfVar1;
        fVar80 = pfVar1[1];
        fVar84 = pfVar1[2];
        fVar88 = pfVar1[3];
        pfVar1 = (float *)(uVar34 + 0x40 + lVar29);
        fVar75 = fVar61 - *pfVar1;
        fVar79 = fVar65 - pfVar1[1];
        fVar83 = fVar69 - pfVar1[2];
        fVar87 = fVar73 - pfVar1[3];
        pfVar2 = (float *)(uVar34 + 0x50 + lVar29);
        fVar114 = fVar76 - *pfVar2;
        fVar116 = fVar80 - pfVar2[1];
        fVar118 = fVar84 - pfVar2[2];
        fVar120 = fVar88 - pfVar2[3];
        pfVar4 = (float *)(uVar34 + 0x90 + lVar29);
        fVar106 = *pfVar4 - fVar66;
        fVar108 = pfVar4[1] - fVar70;
        fVar110 = pfVar4[2] - fVar39;
        fVar112 = pfVar4[3] - fVar41;
        pfVar5 = (float *)(uVar34 + 0xa0 + lVar29);
        fVar44 = *pfVar5 - fVar61;
        fVar48 = pfVar5[1] - fVar65;
        fVar52 = pfVar5[2] - fVar69;
        fVar56 = pfVar5[3] - fVar73;
        pfVar6 = (float *)(uVar34 + 0xb0 + lVar29);
        fVar107 = *pfVar6 - fVar76;
        fVar109 = pfVar6[1] - fVar80;
        fVar111 = pfVar6[2] - fVar84;
        fVar113 = pfVar6[3] - fVar88;
        fVar36 = fVar114 * fVar44 - fVar75 * fVar107;
        fVar37 = fVar116 * fVar48 - fVar79 * fVar109;
        fVar38 = fVar118 * fVar52 - fVar83 * fVar111;
        fVar40 = fVar120 * fVar56 - fVar87 * fVar113;
        fVar94 = fVar66 - fVar42;
        fVar96 = fVar70 - fVar42;
        fVar98 = fVar39 - fVar42;
        fVar100 = fVar41 - fVar42;
        fVar61 = fVar61 - fVar46;
        fVar65 = fVar65 - fVar46;
        fVar69 = fVar69 - fVar46;
        fVar73 = fVar73 - fVar46;
        fVar90 = fVar94 * fVar58 - fVar61 * fVar54;
        fVar91 = fVar96 * fVar58 - fVar65 * fVar54;
        fVar92 = fVar98 * fVar58 - fVar69 * fVar54;
        fVar93 = fVar100 * fVar58 - fVar73 * fVar54;
        pfVar3 = (float *)(uVar34 + 0x30 + lVar29);
        fVar66 = fVar66 - *pfVar3;
        fVar70 = fVar70 - pfVar3[1];
        fVar39 = fVar39 - pfVar3[2];
        fVar41 = fVar41 - pfVar3[3];
        fVar102 = fVar66 * fVar107 - fVar114 * fVar106;
        fVar103 = fVar70 * fVar109 - fVar116 * fVar108;
        fVar104 = fVar39 * fVar111 - fVar118 * fVar110;
        fVar105 = fVar41 * fVar113 - fVar120 * fVar112;
        fVar76 = fVar76 - fVar50;
        fVar80 = fVar80 - fVar50;
        fVar84 = fVar84 - fVar50;
        fVar88 = fVar88 - fVar50;
        fVar95 = fVar76 * fVar54 - fVar94 * fVar62;
        fVar97 = fVar80 * fVar54 - fVar96 * fVar62;
        fVar99 = fVar84 * fVar54 - fVar98 * fVar62;
        fVar101 = fVar88 * fVar54 - fVar100 * fVar62;
        fVar45 = fVar75 * fVar106 - fVar66 * fVar44;
        fVar49 = fVar79 * fVar108 - fVar70 * fVar48;
        fVar53 = fVar83 * fVar110 - fVar39 * fVar52;
        fVar57 = fVar87 * fVar112 - fVar41 * fVar56;
        fVar115 = fVar61 * fVar62 - fVar76 * fVar58;
        fVar117 = fVar65 * fVar62 - fVar80 * fVar58;
        fVar119 = fVar69 * fVar62 - fVar84 * fVar58;
        fVar121 = fVar73 * fVar62 - fVar88 * fVar58;
        fVar77 = fVar36 * fVar54 + fVar102 * fVar58 + fVar45 * fVar62;
        fVar81 = fVar37 * fVar54 + fVar103 * fVar58 + fVar49 * fVar62;
        fVar85 = fVar38 * fVar54 + fVar104 * fVar58 + fVar53 * fVar62;
        fVar89 = fVar40 * fVar54 + fVar105 * fVar58 + fVar57 * fVar62;
        uVar47 = (uint)fVar77 & 0x80000000;
        uVar51 = (uint)fVar81 & 0x80000000;
        uVar55 = (uint)fVar85 & 0x80000000;
        uVar59 = (uint)fVar89 & 0x80000000;
        fVar44 = (float)((uint)(fVar106 * fVar115 + fVar44 * fVar95 + fVar107 * fVar90) ^ uVar47);
        fVar48 = (float)((uint)(fVar108 * fVar117 + fVar48 * fVar97 + fVar109 * fVar91) ^ uVar51);
        fVar52 = (float)((uint)(fVar110 * fVar119 + fVar52 * fVar99 + fVar111 * fVar92) ^ uVar55);
        fVar56 = (float)((uint)(fVar112 * fVar121 + fVar56 * fVar101 + fVar113 * fVar93) ^ uVar59);
        fVar75 = (float)((uint)(fVar115 * fVar66 + fVar95 * fVar75 + fVar90 * fVar114) ^ uVar47);
        fVar79 = (float)((uint)(fVar117 * fVar70 + fVar97 * fVar79 + fVar91 * fVar116) ^ uVar51);
        fVar83 = (float)((uint)(fVar119 * fVar39 + fVar99 * fVar83 + fVar92 * fVar118) ^ uVar55);
        fVar87 = (float)((uint)(fVar121 * fVar41 + fVar101 * fVar87 + fVar93 * fVar120) ^ uVar59);
        fVar66 = ABS(fVar77);
        fVar70 = ABS(fVar81);
        fVar39 = ABS(fVar85);
        fVar41 = ABS(fVar89);
        bVar21 = ((0.0 <= fVar75 && 0.0 <= fVar44) && fVar77 != 0.0) && fVar44 + fVar75 <= fVar66;
        bVar22 = ((0.0 <= fVar79 && 0.0 <= fVar48) && fVar81 != 0.0) && fVar48 + fVar79 <= fVar70;
        bVar23 = ((0.0 <= fVar83 && 0.0 <= fVar52) && fVar85 != 0.0) && fVar52 + fVar83 <= fVar39;
        bVar24 = ((0.0 <= fVar87 && 0.0 <= fVar56) && fVar89 != 0.0) && fVar56 + fVar87 <= fVar41;
        lVar29 = lVar29 + uVar34;
        auVar20._4_4_ = -(uint)bVar22;
        auVar20._0_4_ = -(uint)bVar21;
        auVar20._8_4_ = -(uint)bVar23;
        auVar20._12_4_ = -(uint)bVar24;
        uVar43 = movmskps((int)psVar35,auVar20);
        if (uVar43 != 0) {
          fVar76 = (float)(uVar47 ^ (uint)(fVar36 * fVar94 + fVar102 * fVar61 + fVar45 * fVar76));
          fVar80 = (float)(uVar51 ^ (uint)(fVar37 * fVar96 + fVar103 * fVar65 + fVar49 * fVar80));
          fVar69 = (float)(uVar55 ^ (uint)(fVar38 * fVar98 + fVar104 * fVar69 + fVar53 * fVar84));
          fVar73 = (float)(uVar59 ^ (uint)(fVar40 * fVar100 + fVar105 * fVar73 + fVar57 * fVar88));
          fVar61 = *(float *)(ray + k * 4 + 0x30);
          fVar65 = *(float *)(ray + k * 4 + 0x80);
          auVar17._4_4_ = -(uint)((fVar80 <= fVar65 * fVar70 && fVar61 * fVar70 < fVar80) && bVar22)
          ;
          auVar17._0_4_ = -(uint)((fVar76 <= fVar65 * fVar66 && fVar61 * fVar66 < fVar76) && bVar21)
          ;
          auVar17._8_4_ = -(uint)((fVar69 <= fVar65 * fVar39 && fVar61 * fVar39 < fVar69) && bVar23)
          ;
          auVar17._12_4_ =
               -(uint)((fVar73 <= fVar65 * fVar41 && fVar61 * fVar41 < fVar73) && bVar24);
          uVar43 = movmskps(uVar43,auVar17);
          if (uVar43 != 0) {
            uVar30 = (ulong)uVar43 & 0xff;
            do {
              uVar15 = 0;
              if (uVar30 != 0) {
                for (; (uVar30 >> uVar15 & 1) == 0; uVar15 = uVar15 + 1) {
                }
              }
              if ((((context->scene->geometries).items[*(uint *)(lVar29 + 0xc0 + uVar15 * 4)].ptr)->
                   mask & *(uint *)(ray + k * 4 + 0x90)) != 0) goto LAB_0026bc98;
              uVar30 = uVar30 ^ 1L << (uVar15 & 0x3f);
            } while (uVar30 != 0);
            uVar43 = 0;
          }
        }
        fVar66 = *(float *)(lVar29 + 0x60);
        fVar70 = *(float *)(lVar29 + 100);
        fVar39 = *(float *)(lVar29 + 0x68);
        fVar41 = *(float *)(lVar29 + 0x6c);
        fVar61 = *(float *)(lVar29 + 0x70);
        fVar65 = *(float *)(lVar29 + 0x74);
        fVar69 = *(float *)(lVar29 + 0x78);
        fVar73 = *(float *)(lVar29 + 0x7c);
        fVar76 = *(float *)(lVar29 + 0x80);
        fVar80 = *(float *)(lVar29 + 0x84);
        fVar84 = *(float *)(lVar29 + 0x88);
        fVar88 = *(float *)(lVar29 + 0x8c);
        fVar106 = fVar66 - *pfVar4;
        fVar107 = fVar70 - pfVar4[1];
        fVar108 = fVar39 - pfVar4[2];
        fVar109 = fVar41 - pfVar4[3];
        fVar110 = fVar61 - *pfVar5;
        fVar112 = fVar65 - pfVar5[1];
        fVar114 = fVar69 - pfVar5[2];
        fVar116 = fVar73 - pfVar5[3];
        fVar83 = fVar76 - *pfVar6;
        fVar89 = fVar80 - pfVar6[1];
        fVar92 = fVar84 - pfVar6[2];
        fVar95 = fVar88 - pfVar6[3];
        fVar44 = *pfVar3 - fVar66;
        fVar49 = pfVar3[1] - fVar70;
        fVar56 = pfVar3[2] - fVar39;
        fVar77 = pfVar3[3] - fVar41;
        fVar45 = *pfVar1 - fVar61;
        fVar52 = pfVar1[1] - fVar65;
        fVar57 = pfVar1[2] - fVar69;
        fVar79 = pfVar1[3] - fVar73;
        fVar98 = *pfVar2 - fVar76;
        fVar100 = pfVar2[1] - fVar80;
        fVar102 = pfVar2[2] - fVar84;
        fVar104 = pfVar2[3] - fVar88;
        fVar66 = fVar66 - fVar42;
        fVar70 = fVar70 - fVar42;
        fVar39 = fVar39 - fVar42;
        fVar41 = fVar41 - fVar42;
        fVar76 = fVar76 - fVar50;
        fVar80 = fVar80 - fVar50;
        fVar84 = fVar84 - fVar50;
        fVar88 = fVar88 - fVar50;
        fVar48 = fVar54 * fVar76 - fVar62 * fVar66;
        fVar53 = fVar54 * fVar80 - fVar62 * fVar70;
        fVar75 = fVar54 * fVar84 - fVar62 * fVar39;
        fVar81 = fVar54 * fVar88 - fVar62 * fVar41;
        fVar85 = fVar45 * fVar83 - fVar110 * fVar98;
        fVar90 = fVar52 * fVar89 - fVar112 * fVar100;
        fVar93 = fVar57 * fVar92 - fVar114 * fVar102;
        fVar96 = fVar79 * fVar95 - fVar116 * fVar104;
        fVar61 = fVar61 - fVar46;
        fVar65 = fVar65 - fVar46;
        fVar69 = fVar69 - fVar46;
        fVar73 = fVar73 - fVar46;
        fVar111 = fVar62 * fVar61 - fVar58 * fVar76;
        fVar113 = fVar62 * fVar65 - fVar58 * fVar80;
        fVar115 = fVar62 * fVar69 - fVar58 * fVar84;
        fVar117 = fVar62 * fVar73 - fVar58 * fVar88;
        fVar118 = fVar106 * fVar98 - fVar44 * fVar83;
        fVar119 = fVar107 * fVar100 - fVar49 * fVar89;
        fVar120 = fVar108 * fVar102 - fVar56 * fVar92;
        fVar121 = fVar109 * fVar104 - fVar77 * fVar95;
        fVar36 = fVar44 * fVar110 - fVar106 * fVar45;
        fVar37 = fVar49 * fVar112 - fVar107 * fVar52;
        fVar38 = fVar56 * fVar114 - fVar108 * fVar57;
        fVar40 = fVar77 * fVar116 - fVar109 * fVar79;
        fVar99 = fVar58 * fVar66 - fVar54 * fVar61;
        fVar101 = fVar58 * fVar70 - fVar54 * fVar65;
        fVar103 = fVar58 * fVar39 - fVar54 * fVar69;
        fVar105 = fVar58 * fVar41 - fVar54 * fVar73;
        fVar87 = fVar54 * fVar85 + fVar58 * fVar118 + fVar62 * fVar36;
        fVar91 = fVar54 * fVar90 + fVar58 * fVar119 + fVar62 * fVar37;
        fVar94 = fVar54 * fVar93 + fVar58 * fVar120 + fVar62 * fVar38;
        fVar97 = fVar54 * fVar96 + fVar58 * fVar121 + fVar62 * fVar40;
        uVar47 = (uint)fVar87 & 0x80000000;
        uVar51 = (uint)fVar91 & 0x80000000;
        uVar55 = (uint)fVar94 & 0x80000000;
        uVar59 = (uint)fVar97 & 0x80000000;
        fVar98 = (float)((uint)(fVar44 * fVar111 + fVar45 * fVar48 + fVar98 * fVar99) ^ uVar47);
        fVar52 = (float)((uint)(fVar49 * fVar113 + fVar52 * fVar53 + fVar100 * fVar101) ^ uVar51);
        fVar56 = (float)((uint)(fVar56 * fVar115 + fVar57 * fVar75 + fVar102 * fVar103) ^ uVar55);
        fVar57 = (float)((uint)(fVar77 * fVar117 + fVar79 * fVar81 + fVar104 * fVar105) ^ uVar59);
        fVar77 = (float)((uint)(fVar111 * fVar106 + fVar48 * fVar110 + fVar99 * fVar83) ^ uVar47);
        fVar53 = (float)((uint)(fVar113 * fVar107 + fVar53 * fVar112 + fVar101 * fVar89) ^ uVar51);
        fVar75 = (float)((uint)(fVar115 * fVar108 + fVar75 * fVar114 + fVar103 * fVar92) ^ uVar55);
        fVar79 = (float)((uint)(fVar117 * fVar109 + fVar81 * fVar116 + fVar105 * fVar95) ^ uVar59);
        fVar44 = ABS(fVar87);
        fVar45 = ABS(fVar91);
        fVar48 = ABS(fVar94);
        fVar49 = ABS(fVar97);
        bVar21 = ((0.0 <= fVar77 && 0.0 <= fVar98) && fVar87 != 0.0) && fVar98 + fVar77 <= fVar44;
        bVar22 = ((0.0 <= fVar53 && 0.0 <= fVar52) && fVar91 != 0.0) && fVar52 + fVar53 <= fVar45;
        bVar23 = ((0.0 <= fVar75 && 0.0 <= fVar56) && fVar94 != 0.0) && fVar56 + fVar75 <= fVar48;
        bVar24 = ((0.0 <= fVar79 && 0.0 <= fVar57) && fVar97 != 0.0) && fVar57 + fVar79 <= fVar49;
        auVar19._4_4_ = -(uint)bVar22;
        auVar19._0_4_ = -(uint)bVar21;
        auVar19._8_4_ = -(uint)bVar23;
        auVar19._12_4_ = -(uint)bVar24;
        uVar43 = movmskps(uVar43,auVar19);
        psVar35 = (size_t *)(ulong)uVar43;
        if (uVar43 != 0) {
          fVar61 = (float)(uVar47 ^ (uint)(fVar66 * fVar85 + fVar61 * fVar118 + fVar76 * fVar36));
          fVar65 = (float)(uVar51 ^ (uint)(fVar70 * fVar90 + fVar65 * fVar119 + fVar80 * fVar37));
          fVar39 = (float)(uVar55 ^ (uint)(fVar39 * fVar93 + fVar69 * fVar120 + fVar84 * fVar38));
          fVar41 = (float)(uVar59 ^ (uint)(fVar41 * fVar96 + fVar73 * fVar121 + fVar88 * fVar40));
          fVar66 = *(float *)(ray + k * 4 + 0x30);
          fVar70 = *(float *)(ray + k * 4 + 0x80);
          auVar18._4_4_ = -(uint)((fVar65 <= fVar70 * fVar45 && fVar66 * fVar45 < fVar65) && bVar22)
          ;
          auVar18._0_4_ = -(uint)((fVar61 <= fVar70 * fVar44 && fVar66 * fVar44 < fVar61) && bVar21)
          ;
          auVar18._8_4_ = -(uint)((fVar39 <= fVar70 * fVar48 && fVar66 * fVar48 < fVar39) && bVar23)
          ;
          auVar18._12_4_ =
               -(uint)((fVar41 <= fVar70 * fVar49 && fVar66 * fVar49 < fVar41) && bVar24);
          uVar43 = movmskps(uVar43,auVar18);
          psVar35 = (size_t *)(ulong)uVar43;
          if (uVar43 != 0) {
            uVar30 = (ulong)psVar35 & 0xff;
            do {
              uVar15 = 0;
              if (uVar30 != 0) {
                for (; (uVar30 >> uVar15 & 1) == 0; uVar15 = uVar15 + 1) {
                }
              }
              if ((((context->scene->geometries).items[*(uint *)(lVar29 + 0xc0 + uVar15 * 4)].ptr)->
                   mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
LAB_0026bc98:
                *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
                return bVar32;
              }
              uVar30 = uVar30 ^ 1L << (uVar15 & 0x3f);
            } while (uVar30 != 0);
            psVar35 = (size_t *)0x0;
          }
        }
        unaff_RBP = unaff_RBP + 1;
      } while (unaff_RBP != uVar28 - 8);
    }
joined_r0x0026b546:
    bVar32 = puVar25 != &local_7d8;
    if (!bVar32) {
      return bVar32;
    }
  } while( true );
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }